

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O0

Mat Eye(int n)

{
  double *extraout_RDX;
  int in_ESI;
  undefined4 in_register_0000003c;
  Mat *this;
  Mat MVar1;
  int local_20;
  int local_1c;
  int i;
  int j;
  int n_local;
  Mat *eyeMat;
  
  this = (Mat *)CONCAT44(in_register_0000003c,n);
  Mat::Mat(this,in_ESI,in_ESI);
  for (local_1c = 0; local_1c < in_ESI * in_ESI; local_1c = local_1c + 1) {
    this->v_[local_1c] = 0.0;
  }
  for (local_20 = 0; local_20 < in_ESI; local_20 = local_20 + 1) {
    this->v_[local_20 * in_ESI + local_20] = 1.0;
  }
  MVar1.v_ = extraout_RDX;
  MVar1._0_8_ = this;
  return MVar1;
}

Assistant:

Mat Eye(const int n)
{
	Mat eyeMat(n, n);
	for (int j=0; j<n*n; j++)
		eyeMat.v_[j] = 0.0;
	for (int i=0; i<n; i++)
		eyeMat.v_[i*n + i] = 1.0;
	return eyeMat;
}